

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O1

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *__s;
  long lVar5;
  long lVar6;
  vorbis_info_mapping0 *info;
  
  __s = (uint *)calloc(1,0xc88);
  if (0 < vi->channels) {
    pvVar1 = vi->codec_setup;
    lVar5 = oggpack_read(opb,1);
    if (-1 < (int)lVar5) {
      if ((int)lVar5 == 0) {
        *__s = 1;
      }
      else {
        lVar5 = oggpack_read(opb,4);
        *__s = (uint)lVar5 + 1;
        if (0x7ffffffe < (uint)lVar5) goto LAB_001e28f8;
      }
      lVar5 = oggpack_read(opb,1);
      if (-1 < (int)lVar5) {
        if ((int)lVar5 != 0) {
          lVar5 = oggpack_read(opb,8);
          __s[0x121] = (uint)lVar5 + 1;
          if (0x7ffffffe < (uint)lVar5) goto LAB_001e28f8;
          if (0 < (int)__s[0x121]) {
            lVar5 = 0;
            do {
              iVar2 = ov_ilog(vi->channels - 1);
              lVar6 = oggpack_read(opb,iVar2);
              uVar4 = (uint)lVar6;
              __s[lVar5 + 0x122] = uVar4;
              iVar2 = ov_ilog(vi->channels - 1);
              lVar6 = oggpack_read(opb,iVar2);
              uVar3 = (uint)lVar6;
              __s[lVar5 + 0x222] = uVar3;
              if (((((int)uVar4 < 0) || ((int)uVar3 < 0)) || (uVar4 == uVar3)) ||
                 ((vi->channels <= (int)uVar4 || (vi->channels <= (int)uVar3)))) goto LAB_001e28f8;
              lVar5 = lVar5 + 1;
            } while (lVar5 < (int)__s[0x121]);
          }
        }
        lVar5 = oggpack_read(opb,2);
        if (lVar5 == 0) {
          uVar3 = *__s;
          if ((1 < (long)(int)uVar3) && (0 < vi->channels)) {
            lVar5 = 0;
            do {
              lVar6 = oggpack_read(opb,4);
              __s[lVar5 + 1] = (uint)lVar6;
              if (uVar3 <= (uint)lVar6) goto LAB_001e28f8;
              lVar5 = lVar5 + 1;
            } while (lVar5 < vi->channels);
          }
          if ((int)uVar3 < 1) {
            return __s;
          }
          lVar5 = 0;
          while( true ) {
            oggpack_read(opb,8);
            lVar6 = oggpack_read(opb,8);
            uVar4 = (uint)lVar6;
            __s[lVar5 + 0x101] = uVar4;
            if (((int)uVar4 < 0) || (*(int *)((long)pvVar1 + 0x18) <= (int)uVar4)) break;
            lVar6 = oggpack_read(opb,8);
            uVar4 = (uint)lVar6;
            __s[lVar5 + 0x111] = uVar4;
            if (((int)uVar4 < 0) || (*(int *)((long)pvVar1 + 0x1c) <= (int)uVar4)) break;
            lVar5 = lVar5 + 1;
            if ((int)uVar3 == lVar5) {
              return __s;
            }
          }
        }
      }
    }
  }
LAB_001e28f8:
  if (__s != (uint *)0x0) {
    memset(__s,0,0xc88);
    free(__s);
  }
  return (vorbis_info_mapping *)0x0;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i,b;
  vorbis_info_mapping0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;
  if(vi->channels<=0)goto err_out;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->submaps=oggpack_read(opb,4)+1;
    if(info->submaps<=0)goto err_out;
  }else
    info->submaps=1;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->coupling_steps=oggpack_read(opb,8)+1;
    if(info->coupling_steps<=0)goto err_out;
    for(i=0;i<info->coupling_steps;i++){
      /* vi->channels > 0 is enforced in the caller */
      int testM=info->coupling_mag[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));
      int testA=info->coupling_ang[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));

      if(testM<0 ||
         testA<0 ||
         testM==testA ||
         testM>=vi->channels ||
         testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)!=0)goto err_out; /* 2,3:reserved */

  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps || info->chmuxlist[i]<0)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    oggpack_read(opb,8); /* time submap unused */
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors || info->floorsubmap[i]<0)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues || info->residuesubmap[i]<0)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}